

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

VariableP<float> __thiscall
deqp::gls::BuiltinPrecisionTests::bindExpression<float>
          (BuiltinPrecisionTests *this,string *name,ExpandContext *ctx,ExprP<float> *expr)

{
  SharedPtrStateBase *extraout_RDX;
  VariableP<float> VVar1;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Statement> SStack_28;
  
  ExpandContext::genSym<float>((ExpandContext *)this,(string *)ctx);
  variableDeclaration<float>((BuiltinPrecisionTests *)&SStack_28,(VariableP<float> *)this,expr);
  std::
  vector<deqp::gls::BuiltinPrecisionTests::StatementP,_std::allocator<deqp::gls::BuiltinPrecisionTests::StatementP>_>
  ::push_back(&ctx->m_statements,(value_type *)&SStack_28);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Statement>::~SharedPtr(&SStack_28);
  VVar1.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_state =
       extraout_RDX;
  VVar1.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr =
       (Variable<float> *)this;
  return (VariableP<float>)
         VVar1.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>;
}

Assistant:

VariableP<T> bindExpression (const string& name, ExpandContext& ctx, const ExprP<T>& expr)
{
	VariableP<T> var = ctx.genSym<T>(name);
	ctx.addStatement(variableDeclaration(var, expr));
	return var;
}